

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamReaderPrivate::LoadNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  pointer *ppCVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  pointer pCVar5;
  iterator __position;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  CigarOp CVar29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  size_t sVar33;
  long lVar34;
  char *pcVar35;
  BamReaderPrivate *this_00;
  ulong uVar36;
  undefined1 uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  CigarOp op;
  char x [32];
  char buffer [4];
  RaiiBuffer allCharData;
  CigarOp local_80;
  char *local_78;
  uint local_6c;
  undefined4 local_68;
  undefined4 local_64;
  byte local_60 [2];
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  uint32_t local_58;
  int32_t local_54;
  int32_t local_50;
  int32_t local_4c;
  uint local_44;
  RaiiBuffer local_40;
  
  local_44 = 0;
  this_00 = (BamReaderPrivate *)&this->m_stream;
  BgzfStream::Read((BgzfStream *)this_00,(char *)&local_44,4);
  (alignment->SupportData).BlockLength = local_44;
  if (this->m_isBigEndian == true) {
    (alignment->SupportData).BlockLength =
         local_44 >> 0x18 | (local_44 & 0xff0000) >> 8 | (local_44 & 0xff00) << 8 | local_44 << 0x18
    ;
  }
  if (((alignment->SupportData).BlockLength == 0) ||
     (sVar33 = BgzfStream::Read((BgzfStream *)this_00,(char *)&local_68,0x20), sVar33 != 0x20)) {
    uVar37 = 0;
  }
  else {
    if (this->m_isBigEndian == true) {
      lVar34 = 0;
      do {
        auVar39 = *(undefined1 (*) [16])(&local_68 + lVar34);
        auVar40[1] = 0;
        auVar40[0] = auVar39[8];
        auVar40[2] = auVar39[9];
        auVar40[3] = 0;
        auVar40[4] = auVar39[10];
        auVar40[5] = 0;
        auVar40[6] = auVar39[0xb];
        auVar40[7] = 0;
        auVar40[8] = auVar39[0xc];
        auVar40[9] = 0;
        auVar40[10] = auVar39[0xd];
        auVar40[0xb] = 0;
        auVar40[0xc] = auVar39[0xe];
        auVar40[0xd] = 0;
        auVar40[0xe] = auVar39[0xf];
        auVar40[0xf] = 0;
        auVar40 = pshuflw(auVar40,auVar40,0x1b);
        auVar40 = pshufhw(auVar40,auVar40,0x1b);
        auVar22[0xd] = 0;
        auVar22._0_13_ = auVar39._0_13_;
        auVar22[0xe] = auVar39[7];
        auVar23[0xc] = auVar39[6];
        auVar23._0_12_ = auVar39._0_12_;
        auVar23._13_2_ = auVar22._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar39._0_11_;
        auVar24._12_3_ = auVar23._12_3_;
        auVar25[10] = auVar39[5];
        auVar25._0_10_ = auVar39._0_10_;
        auVar25._11_4_ = auVar24._11_4_;
        auVar26[9] = 0;
        auVar26._0_9_ = auVar39._0_9_;
        auVar26._10_5_ = auVar25._10_5_;
        auVar27[8] = auVar39[4];
        auVar27._0_8_ = auVar39._0_8_;
        auVar27._9_6_ = auVar26._9_6_;
        auVar30._7_8_ = 0;
        auVar30._0_7_ = auVar27._8_7_;
        auVar31._1_8_ = SUB158(auVar30 << 0x40,7);
        auVar31[0] = auVar39[3];
        auVar31._9_6_ = 0;
        auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
        auVar32[0] = auVar39[2];
        auVar32._11_4_ = 0;
        auVar28[2] = auVar39[1];
        auVar28._0_2_ = auVar39._0_2_;
        auVar28._3_12_ = SUB1512(auVar32 << 0x20,3);
        auVar39._0_2_ = auVar39._0_2_ & 0xff;
        auVar39._2_13_ = auVar28._2_13_;
        auVar39[0xf] = 0;
        auVar39 = pshuflw(auVar39,auVar39,0x1b);
        auVar39 = pshufhw(auVar39,auVar39,0x1b);
        sVar6 = auVar39._0_2_;
        sVar7 = auVar39._2_2_;
        sVar8 = auVar39._4_2_;
        sVar9 = auVar39._6_2_;
        sVar10 = auVar39._8_2_;
        sVar11 = auVar39._10_2_;
        sVar12 = auVar39._12_2_;
        sVar13 = auVar39._14_2_;
        sVar14 = auVar40._0_2_;
        sVar15 = auVar40._2_2_;
        sVar16 = auVar40._4_2_;
        sVar17 = auVar40._6_2_;
        sVar18 = auVar40._8_2_;
        sVar19 = auVar40._10_2_;
        sVar20 = auVar40._12_2_;
        sVar21 = auVar40._14_2_;
        lVar2 = lVar34 * 4;
        *(char *)(&local_68 + lVar34) = (0 < sVar6) * (sVar6 < 0x100) * auVar39[0] - (0xff < sVar6);
        *(char *)((long)&local_68 + lVar2 + 1) =
             (0 < sVar7) * (sVar7 < 0x100) * auVar39[2] - (0xff < sVar7);
        *(char *)((long)&local_68 + lVar2 + 2) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar39[4] - (0xff < sVar8);
        *(char *)((long)&local_68 + lVar2 + 3) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar39[6] - (0xff < sVar9);
        local_60[lVar2 + -4] = (0 < sVar10) * (sVar10 < 0x100) * auVar39[8] - (0xff < sVar10);
        local_60[lVar2 + -3] = (0 < sVar11) * (sVar11 < 0x100) * auVar39[10] - (0xff < sVar11);
        local_60[lVar2 + -2] = (0 < sVar12) * (sVar12 < 0x100) * auVar39[0xc] - (0xff < sVar12);
        local_60[lVar2 + -1] = (0 < sVar13) * (sVar13 < 0x100) * auVar39[0xe] - (0xff < sVar13);
        local_60[lVar2] = (0 < sVar14) * (sVar14 < 0x100) * auVar40[0] - (0xff < sVar14);
        local_60[lVar2 + 1] = (0 < sVar15) * (sVar15 < 0x100) * auVar40[2] - (0xff < sVar15);
        *(char *)(&local_5e + lVar34 * 2) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar40[4] - (0xff < sVar16);
        *(char *)((long)&local_5e + lVar2 + 1) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar40[6] - (0xff < sVar17);
        *(char *)(&local_5c + lVar34 * 2) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar40[8] - (0xff < sVar18);
        *(char *)((long)&local_5c + lVar2 + 1) =
             (0 < sVar19) * (sVar19 < 0x100) * auVar40[10] - (0xff < sVar19);
        *(char *)(&local_5a + lVar34 * 2) =
             (0 < sVar20) * (sVar20 < 0x100) * auVar40[0xc] - (0xff < sVar20);
        *(char *)((long)&local_5a + lVar2 + 1) =
             (0 < sVar21) * (sVar21 < 0x100) * auVar40[0xe] - (0xff < sVar21);
        lVar34 = lVar34 + 4;
      } while (lVar34 != 8);
    }
    alignment->RefID = local_68;
    alignment->Position = local_64;
    alignment->Bin = local_5e;
    alignment->MapQuality = (ushort)local_60[1];
    (alignment->SupportData).QueryNameLength = (uint)local_60[0];
    alignment->AlignmentFlag = (uint)local_5a;
    (alignment->SupportData).NumCigarOperations = (uint)local_5c;
    (alignment->SupportData).QuerySequenceLength = local_58;
    alignment->MateRefID = local_54;
    alignment->MatePosition = local_50;
    alignment->InsertSize = local_4c;
    alignment->Length = local_58;
    uVar36 = (ulong)((alignment->SupportData).BlockLength - 0x20);
    pcVar35 = (char *)operator_new__(uVar36);
    memset(pcVar35,0,uVar36);
    local_40.Buffer = pcVar35;
    local_40.NumBytes = uVar36;
    sVar33 = BgzfStream::Read((BgzfStream *)this_00,pcVar35,uVar36);
    uVar38 = CONCAT71((int7)((ulong)&local_44 >> 8),sVar33 == uVar36);
    if (sVar33 == uVar36) {
      local_6c = (uint)uVar38;
      local_78 = pcVar35;
      Tag2Cigar(this_00,alignment,&local_40);
      std::__cxx11::string::_M_replace
                ((ulong)&alignment->SupportData,0,
                 (char *)(alignment->SupportData).AllCharData._M_string_length,(ulong)pcVar35);
      uVar3 = (alignment->SupportData).QueryNameLength;
      local_80._0_4_ = local_80._0_4_ & 0xffffff00;
      local_80.Length = 0;
      pCVar5 = (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((alignment->CigarData).
          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar5) {
        (alignment->CigarData).
        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar5;
      }
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::reserve
                (&alignment->CigarData,(ulong)(alignment->SupportData).NumCigarOperations);
      pcVar35 = local_78;
      if ((alignment->SupportData).NumCigarOperations != 0) {
        uVar36 = 0;
        do {
          if (this->m_isBigEndian == true) {
            uVar4 = *(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3);
            *(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          }
          local_80.Length = *(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) >> 4;
          local_80.Type = "MIDNSHP=X"[*(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) & 0xf];
          __position._M_current =
               (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (alignment->CigarData).
              super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>>::
            _M_realloc_insert<BamTools::CigarOp_const&>
                      ((vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>> *)
                       &alignment->CigarData,__position,&local_80);
          }
          else {
            CVar29.Length = local_80.Length;
            CVar29.Type = "MIDNSHP=X"[*(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) & 0xf];
            CVar29._1_3_ = local_80._1_3_;
            *__position._M_current = CVar29;
            ppCVar1 = &(alignment->CigarData).
                       super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 < (alignment->SupportData).NumCigarOperations);
      }
      uVar38 = (ulong)local_6c;
      pcVar35 = local_78;
    }
    uVar37 = (undefined1)uVar38;
    operator_delete__(pcVar35);
  }
  return (bool)uVar37;
}

Assistant:

bool BamReaderPrivate::LoadNextAlignment(BamAlignment& alignment)
{

    // read in the 'block length' value, make sure it's not zero
    char buffer[sizeof(uint32_t)];
    std::fill_n(buffer, sizeof(uint32_t), 0);
    m_stream.Read(buffer, sizeof(uint32_t));
    alignment.SupportData.BlockLength = BamTools::UnpackUnsignedInt(buffer);
    if (m_isBigEndian) BamTools::SwapEndian_32(alignment.SupportData.BlockLength);
    if (alignment.SupportData.BlockLength == 0) return false;

    // read in core alignment data, make sure the right size of data was read
    char x[Constants::BAM_CORE_SIZE];
    if (m_stream.Read(x, Constants::BAM_CORE_SIZE) != Constants::BAM_CORE_SIZE) return false;

    // swap core endian-ness if necessary
    if (m_isBigEndian) {
        for (unsigned int i = 0; i < Constants::BAM_CORE_SIZE; i += sizeof(uint32_t))
            BamTools::SwapEndian_32p(&x[i]);
    }

    // set BamAlignment 'core' and 'support' data
    alignment.RefID = BamTools::UnpackSignedInt(&x[0]);
    alignment.Position = BamTools::UnpackSignedInt(&x[4]);

    unsigned int tempValue = BamTools::UnpackUnsignedInt(&x[8]);
    alignment.Bin = tempValue >> 16;
    alignment.MapQuality = tempValue >> 8 & 0xff;
    alignment.SupportData.QueryNameLength = tempValue & 0xff;

    tempValue = BamTools::UnpackUnsignedInt(&x[12]);
    alignment.AlignmentFlag = tempValue >> 16;
    alignment.SupportData.NumCigarOperations = tempValue & 0xffff;

    alignment.SupportData.QuerySequenceLength = BamTools::UnpackUnsignedInt(&x[16]);
    alignment.MateRefID = BamTools::UnpackSignedInt(&x[20]);
    alignment.MatePosition = BamTools::UnpackSignedInt(&x[24]);
    alignment.InsertSize = BamTools::UnpackSignedInt(&x[28]);

    // set BamAlignment length
    alignment.Length = alignment.SupportData.QuerySequenceLength;

    // read in character data - make sure proper data size was read
    bool readCharDataOK = false;
    unsigned int dataLength = alignment.SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    RaiiBuffer allCharData(dataLength);

    if (m_stream.Read(allCharData.Buffer, dataLength) == dataLength) {

        int OldNumCigarOperations = alignment.SupportData.NumCigarOperations;
        if (Tag2Cigar(alignment, allCharData)) dataLength -= 8 + OldNumCigarOperations * 4;

        // store 'allCharData' in supportData structure
        alignment.SupportData.AllCharData.assign((const char*)allCharData.Buffer, dataLength);

        // set success flag
        readCharDataOK = true;

        // save CIGAR ops
        // need to calculate this here so that  BamAlignment::GetEndPosition() performs correctly,
        // even when GetNextAlignmentCore() is called
        const unsigned int cigarDataOffset = alignment.SupportData.QueryNameLength;
        uint32_t* cigarData = (uint32_t*)(allCharData.Buffer + cigarDataOffset);
        CigarOp op;
        alignment.CigarData.clear();
        alignment.CigarData.reserve(alignment.SupportData.NumCigarOperations);
        for (unsigned int i = 0; i < alignment.SupportData.NumCigarOperations; ++i) {

            // swap endian-ness if necessary
            if (m_isBigEndian) BamTools::SwapEndian_32(cigarData[i]);

            // build CigarOp structure
            op.Length = (cigarData[i] >> Constants::BAM_CIGAR_SHIFT);
            op.Type = Constants::BAM_CIGAR_LOOKUP[(cigarData[i] & Constants::BAM_CIGAR_MASK)];

            // save CigarOp
            alignment.CigarData.push_back(op);
        }
    }

    // return success/failure
    return readCharDataOK;
}